

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::DOMCharacterDataImpl
          (DOMCharacterDataImpl *this,DOMDocument *doc,XMLCh *dat,XMLSize_t len)

{
  int iVar1;
  DOMBuffer *this_00;
  undefined4 extraout_var;
  DOMDocumentImpl *this_01;
  
  this_01 = (DOMDocumentImpl *)&doc[-1].super_DOMNode;
  if (doc == (DOMDocument *)0x0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  this->fDoc = this_01;
  this_00 = DOMDocumentImpl::popBuffer(this_01,len + 1);
  this->fDataBuf = this_00;
  if (this_00 == (DOMBuffer *)0x0) {
    iVar1 = (*(this->fDoc->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this->fDoc,0x20);
    this_00 = (DOMBuffer *)CONCAT44(extraout_var,iVar1);
    DOMBuffer::DOMBuffer(this_00,this->fDoc,len + 0xf);
    this->fDataBuf = this_00;
  }
  DOMBuffer::set(this_00,dat,len);
  return;
}

Assistant:

DOMCharacterDataImpl::
DOMCharacterDataImpl(DOMDocument *doc, const XMLCh* dat, XMLSize_t len)
{
    fDoc = (DOMDocumentImpl*)doc;

    fDataBuf = fDoc->popBuffer(len+1);

    if (!fDataBuf)
        fDataBuf = new (fDoc) DOMBuffer(fDoc, len+15);

    fDataBuf->set(dat, len);
}